

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.cpp
# Opt level: O3

void __thiscall CVmMetaTable::create_intrinsic_class_instances(CVmMetaTable *this)

{
  vm_obj_id_t obj;
  vm_obj_id_t *pvVar1;
  ulong uVar2;
  
  if (this->count_ != 0) {
    pvVar1 = &this->table_->class_obj_;
    uVar2 = 0;
    do {
      obj = *pvVar1;
      if (obj == 0) {
        CVmObjClass::create_dyn((uint)uVar2);
        obj = *pvVar1;
      }
      CVmObjTable::add_to_globals(&G_obj_table_X,obj);
      uVar2 = uVar2 + 1;
      pvVar1 = pvVar1 + 0xe;
    } while (uVar2 < this->count_);
  }
  return;
}

Assistant:

void CVmMetaTable::create_intrinsic_class_instances(VMG0_)
{
    size_t idx;
    vm_meta_entry_t *entry;
    
    /* go through our table */
    for (idx = 0, entry = table_ ; idx < count_ ; ++idx, ++entry)
    {
        /* if this entry has no associated class object, create one for it */
        if (entry->class_obj_ == VM_INVALID_OBJ)
        {
            /* 
             *   create the class object - it will automatically register
             *   itself to fill in the entry 
             */
            CVmObjClass::create_dyn(vmg_ idx);
        }

        /* 
         *   Add this object to the machine globals, if it's not a root
         *   object.  Any dynamically-created intrinsic class instance must
         *   be made a machine global because it will always be reachable as
         *   the class object for the metaclass, but the metclass won't trace
         *   the object during garbage collection, so we have to set up a
         *   global to make sure the gc knows it's always reachable.
         */
        G_obj_table->add_to_globals(entry->class_obj_);
    }
}